

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

bool __thiscall HighsLp::hasInfiniteCost(HighsLp *this,double infinite_cost)

{
  const_reference pvVar1;
  int *in_RDI;
  double in_XMM0_Qa;
  HighsInt iCol;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (*in_RDI <= local_1c) {
      return false;
    }
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)local_1c);
    if (in_XMM0_Qa <= *pvVar1) break;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)local_1c);
    if (*pvVar1 <= -in_XMM0_Qa) {
      return true;
    }
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool HighsLp::hasInfiniteCost(const double infinite_cost) const {
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
    if (this->col_cost_[iCol] >= infinite_cost) return true;
    if (this->col_cost_[iCol] <= -infinite_cost) return true;
  }
  return false;
}